

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O3

void __thiscall Paragraph::~Paragraph(Paragraph *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TextElement).super_Element._vptr_Element = (_func_int **)&PTR__TextElement_00105c60;
  pcVar2 = (this->super_TextElement).text._M_dataplus._M_p;
  paVar1 = &(this->super_TextElement).text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Paragraph(std::string text)
		:	TextElement{std::move(text)}
	{}